

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O3

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  size_t *psVar1;
  byte bVar2;
  int iVar3;
  huff_entropy_ptr_conflict entropy;
  jpeg_destination_mgr *pjVar4;
  jpeg_component_info *pjVar5;
  jpeg_error_mgr *pjVar6;
  j_compress_ptr pjVar7;
  JOCTET *pJVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  
  entropy = (huff_entropy_ptr_conflict)cinfo->entropy;
  iVar3 = cinfo->Al;
  pjVar4 = cinfo->dest;
  entropy->next_output_byte = pjVar4->next_output_byte;
  entropy->free_in_buffer = pjVar4->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar20 = 0;
    do {
      iVar13 = (int)(*MCU_data[lVar20])[0] >> ((byte)iVar3 & 0x1f);
      iVar16 = cinfo->MCU_membership[lVar20];
      iVar17 = (entropy->saved).last_dc_val[iVar16];
      pjVar5 = cinfo->cur_comp_info[iVar16];
      (entropy->saved).last_dc_val[iVar16] = iVar13;
      uVar18 = 0;
      uVar14 = iVar13 - iVar17;
      if (uVar14 != 0) {
        uVar12 = -uVar14;
        if (0 < (int)uVar14) {
          uVar12 = uVar14;
        }
        uVar18 = (ulong)uVar12;
        uVar11 = 0xffffffff;
        do {
          uVar10 = uVar11;
          uVar18 = uVar18 >> 1;
          uVar11 = uVar10 + 1;
          bVar9 = 1 < uVar12;
          uVar12 = (uint)uVar18;
        } while (bVar9);
        uVar18 = (ulong)(uVar10 + 2);
        if (10 < uVar11) {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 6;
          (*pjVar6->error_exit)((j_common_ptr)cinfo);
        }
      }
      iVar16 = pjVar5->dc_tbl_no;
      if (entropy->gather_statistics == 0) {
        uVar12 = entropy->dc_derived_tbls[iVar16]->ehufco[uVar18];
        bVar2 = entropy->dc_derived_tbls[iVar16]->ehufsi[uVar18];
        iVar16 = (entropy->saved).put_bits;
        if (bVar2 == 0) {
          pjVar7 = entropy->cinfo;
          pjVar6 = pjVar7->err;
          pjVar6->msg_code = 0x29;
          (*pjVar6->error_exit)((j_common_ptr)pjVar7);
          if (entropy->gather_statistics != 0) goto LAB_00116683;
        }
        iVar16 = iVar16 + (char)bVar2;
        uVar19 = (ulong)(uVar12 & ~(uint)(-1L << (bVar2 & 0x3f))) << (0x18U - (char)iVar16 & 0x3f) |
                 (entropy->saved).put_buffer;
        iVar15 = iVar16;
        if (7 < iVar16) {
          do {
            pJVar8 = entropy->next_output_byte;
            entropy->next_output_byte = pJVar8 + 1;
            *pJVar8 = (JOCTET)(uVar19 >> 0x10);
            psVar1 = &entropy->free_in_buffer;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              dump_buffer_e(entropy);
            }
            if ((~(uint)uVar19 & 0xff0000) == 0) {
              pJVar8 = entropy->next_output_byte;
              entropy->next_output_byte = pJVar8 + 1;
              *pJVar8 = '\0';
              psVar1 = &entropy->free_in_buffer;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) {
                dump_buffer_e(entropy);
              }
            }
            uVar19 = uVar19 << 8;
            iVar16 = iVar15 + -8;
            bVar9 = 0xf < iVar15;
            iVar15 = iVar16;
          } while (bVar9);
        }
        (entropy->saved).put_buffer = uVar19;
        (entropy->saved).put_bits = iVar16;
      }
      else {
        entropy->dc_count_ptrs[iVar16][uVar18] = entropy->dc_count_ptrs[iVar16][uVar18] + 1;
      }
LAB_00116683:
      if ((uVar18 != 0) && (entropy->gather_statistics == 0)) {
        iVar16 = (entropy->saved).put_bits + (int)uVar18;
        uVar18 = (ulong)(~(uint)(-1L << ((byte)uVar18 & 0x3f)) & (iVar13 - iVar17 >> 0x1f) + uVar14)
                 << (0x18U - (char)iVar16 & 0x3f) | (entropy->saved).put_buffer;
        iVar17 = iVar16;
        if (7 < iVar16) {
          do {
            pJVar8 = entropy->next_output_byte;
            entropy->next_output_byte = pJVar8 + 1;
            *pJVar8 = (JOCTET)(uVar18 >> 0x10);
            psVar1 = &entropy->free_in_buffer;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              dump_buffer_e(entropy);
            }
            if ((~(uint)uVar18 & 0xff0000) == 0) {
              pJVar8 = entropy->next_output_byte;
              entropy->next_output_byte = pJVar8 + 1;
              *pJVar8 = '\0';
              psVar1 = &entropy->free_in_buffer;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) {
                dump_buffer_e(entropy);
              }
            }
            uVar18 = uVar18 << 8;
            iVar16 = iVar17 + -8;
            bVar9 = 0xf < iVar17;
            iVar17 = iVar16;
          } while (bVar9);
        }
        (entropy->saved).put_buffer = uVar18;
        (entropy->saved).put_bits = iVar16;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < cinfo->blocks_in_MCU);
  }
  pjVar4 = cinfo->dest;
  pjVar4->next_output_byte = entropy->next_output_byte;
  pjVar4->free_in_buffer = entropy->free_in_buffer;
  uVar14 = cinfo->restart_interval;
  if (uVar14 != 0) {
    uVar12 = entropy->restarts_to_go;
    if (entropy->restarts_to_go == 0) {
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
      uVar12 = uVar14;
    }
    entropy->restarts_to_go = uVar12 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp, temp2;
  register int nbits;
  int blkn, ci;
  int Al = cinfo->Al;
  JBLOCKROW block;
  jpeg_component_info * compptr;
  ISHIFT_TEMPS

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    temp2 = IRIGHT_SHIFT((int) ((*block)[0]), Al);

    /* DC differences are figured on the point-transformed values. */
    temp = temp2 - entropy->saved.last_dc_val[ci];
    entropy->saved.last_dc_val[ci] = temp2;

    /* Encode the DC coefficient difference per section G.1.2.1 */
    temp2 = temp;
    if (temp < 0) {
      temp = -temp;		/* temp is abs value of input */
      /* For a negative input, want temp2 = bitwise complement of abs(input) */
      /* This code assumes we are on a two's complement machine */
      temp2--;
    }
    
    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = 0;
    while (temp) {
      nbits++;
      temp >>= 1;
    }
    /* Check for out-of-range coefficient values.
     * Since we're encoding a difference, the range limit is twice as much.
     */
    if (nbits > MAX_COEF_BITS+1)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);
    
    /* Count/emit the Huffman-coded symbol for the number of bits */
    emit_dc_symbol(entropy, compptr->dc_tbl_no, nbits);
    
    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    if (nbits)			/* emit_bits rejects calls with size 0 */
      emit_bits_e(entropy, (unsigned int) temp2, nbits);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}